

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsigc++.h
# Opt level: O2

void __thiscall
sigc::signal<void,_int,_void_*>::emit(signal<void,_int,_void_*> *this,int params,void *params_1)

{
  pointer bg;
  reference this_00;
  functor_base<void,_int,_void_*> *pfVar1;
  undefined4 in_register_00000034;
  EVP_PKEY_CTX *ctx;
  pointer ppVar2;
  vec_iterator<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>_*,_false>
  local_38;
  iterator __begin0;
  
  ctx = (EVP_PKEY_CTX *)CONCAT44(in_register_00000034,params);
  local_38.m_ptr =
       (this->m_funcs).
       super_small_vector_base<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>,_void,_void>
       .super_type.m_holder.m_start;
  ppVar2 = local_38.m_ptr +
           (this->m_funcs).
           super_small_vector_base<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>,_void,_void>
           .super_type.m_holder.m_size;
  while (local_38.m_ptr != ppVar2) {
    this_00 = boost::container::
              vec_iterator<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>_*,_false>
              ::operator*(&local_38);
    if ((this_00->first).px != (functor_base<void,_int,_void_*> *)0x0) {
      pfVar1 = boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>::operator->
                         (&this_00->first);
      ctx = (EVP_PKEY_CTX *)(ulong)(uint)params;
      (*(pfVar1->super_functor_refcnt)._vptr_functor_refcnt[2])(pfVar1,ctx,params_1);
    }
    boost::container::
    vec_iterator<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>_*,_false>
    ::operator++(&local_38);
  }
  cleanup(this,ctx);
  return;
}

Assistant:

void emit(PARAM_TYPES... params) {
        for (auto &it : m_funcs) {
            if (it.first) {
                it.first->operator()(params...);
            }
        }

        cleanup();
    }